

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void pdfloat_symbol(t_pdfloat *x,t_symbol *s)

{
  double dVar1;
  char *local_28;
  char *str_end;
  t_symbol *ptStack_18;
  t_float f;
  t_symbol *s_local;
  t_pdfloat *x_local;
  
  str_end._4_4_ = 0.0;
  local_28 = (char *)0x0;
  ptStack_18 = s;
  s_local = (t_symbol *)x;
  dVar1 = strtod(s->s_name,&local_28);
  str_end._4_4_ = (float)dVar1;
  if (((str_end._4_4_ != 0.0) || (NAN(str_end._4_4_))) || (ptStack_18->s_name != local_28)) {
    *(float *)&s_local[2].s_name = str_end._4_4_;
    outlet_float((_outlet *)s_local[1].s_name,str_end._4_4_);
  }
  else {
    pd_error(s_local,"couldn\'t convert %s to float",ptStack_18->s_name);
  }
  return;
}

Assistant:

static void pdfloat_symbol(t_pdfloat *x, t_symbol *s)
{
    t_float f = 0.0f;
    char *str_end = NULL;
    f = strtod(s->s_name, &str_end);
    if (f == 0 && s->s_name == str_end)
        pd_error(x, "couldn't convert %s to float", s->s_name);
    else outlet_float(x->x_obj.ob_outlet, x->x_f = f);
}